

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void reset_tick_counts(DUMB_IT_SIGRENDERER *sigrenderer)

{
  long lVar1;
  IT_CHANNEL *channel;
  int i;
  DUMB_IT_SIGRENDERER *sigrenderer_local;
  
  for (i = 0; i < 0x40; i = i + 1) {
    lVar1 = (long)i;
    sigrenderer->channel[lVar1].key_off_count = '\0';
    sigrenderer->channel[lVar1].note_cut_count = '\0';
    sigrenderer->channel[lVar1].note_delay_count = '\0';
  }
  return;
}

Assistant:

static void reset_tick_counts(DUMB_IT_SIGRENDERER *sigrenderer)
{
	int i;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		channel->key_off_count = 0;
		channel->note_cut_count = 0;
		channel->note_delay_count = 0;
	}
}